

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall booster::locale::calendar::calendar(calendar *this)

{
  calendar_facet *pcVar1;
  abstract_calendar *paVar2;
  locale *in_RDI;
  locale *__loc;
  locale local_20 [4];
  
  std::locale::locale(in_RDI);
  time_zone::global_abi_cxx11_();
  __loc = in_RDI + 5;
  std::locale::locale(local_20);
  pcVar1 = std::use_facet<booster::locale::calendar_facet>(__loc);
  paVar2 = (abstract_calendar *)(**(code **)(*(long *)pcVar1 + 0x10))();
  hold_ptr<booster::locale::abstract_calendar>::hold_ptr
            ((hold_ptr<booster::locale::abstract_calendar> *)__loc,paVar2);
  std::locale::~locale(local_20);
  paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->
                     ((hold_ptr<booster::locale::abstract_calendar> *)(in_RDI + 5));
  (*paVar2->_vptr_abstract_calendar[10])(paVar2,in_RDI + 1);
  return;
}

Assistant:

calendar::calendar() :
    tz_(time_zone::global()),
    impl_(std::use_facet<calendar_facet>(std::locale()).create_calendar())
{
    impl_->set_timezone(tz_);
}